

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

bool __thiscall ObjectFile::abortTransaction(ObjectFile *this)

{
  MutexLocker *in_RDI;
  MutexLocker lock;
  undefined1 in_stack_000001ff;
  ObjectFile *in_stack_00000200;
  Mutex *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar1;
  byte local_1;
  
  MutexLocker::MutexLocker(in_RDI,in_stack_ffffffffffffffb8);
  if (((ulong)in_RDI[8]._vptr_MutexLocker & 1) == 0) {
    local_1 = 0;
    iVar1 = 1;
  }
  else if (in_RDI[8].mutex == (Mutex *)0x0) {
    softHSMLog(3,"abortTransaction",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x349,"Transaction lock file instance invalid!");
    local_1 = 0;
    iVar1 = 1;
  }
  else {
    File::unlock((File *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (in_RDI[8].mutex != (Mutex *)0x0) {
      (*(in_RDI[8].mutex)->_vptr_Mutex[1])();
    }
    in_RDI[8].mutex = (Mutex *)0x0;
    *(undefined1 *)&in_RDI[8]._vptr_MutexLocker = 0;
    iVar1 = 0;
  }
  MutexLocker::~MutexLocker(in_RDI);
  if (iVar1 == 0) {
    refresh(in_stack_00000200,(bool)in_stack_000001ff);
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ObjectFile::abortTransaction()
{
	{
		MutexLocker lock(objectMutex);

		if (!inTransaction)
		{
			return false;
		}

		if (transactionLockFile == NULL)
		{
			ERROR_MSG("Transaction lock file instance invalid!");

			return false;
		}

		transactionLockFile->unlock();

		delete transactionLockFile;
		transactionLockFile = NULL;
		inTransaction = false;
	}

	// Force reload from disk
	refresh(true);

	return true;
}